

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

shared_ptr<mocker::ast::BuiltinType> __thiscall
mocker::Parser::builtinType(Parser *this,TokIter *iter,TokIter end)

{
  TokenID TVar1;
  Token *in_RCX;
  Token *extraout_RDX;
  shared_ptr<mocker::ast::BuiltinType> sVar3;
  Position beg;
  undefined4 local_48;
  undefined4 uStack_44;
  Position local_40;
  Type *local_30;
  TokIter TVar2;
  
  TVar2._M_current = end._M_current;
  if ((*end._M_current == in_RCX) ||
     (TVar1 = Token::tokenID(*end._M_current), TVar2._M_current = extraout_RDX,
     TVar1 - Void < 0xfffffffd)) {
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
  }
  else {
    Token::position(*end._M_current);
    beg.col._4_4_ = uStack_44;
    beg.col._0_4_ = local_48;
    *(long *)end._M_current = *(long *)end._M_current + 0x38;
    beg.line = (size_t)iter;
    sVar3 = makeNode<mocker::ast::BuiltinType,mocker::ast::BuiltinType::Type&>
                      (this,beg,local_40,local_30);
    TVar2._M_current =
         (Token *)sVar3.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  sVar3.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)TVar2._M_current;
  sVar3.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::BuiltinType>)
         sVar3.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::BuiltinType> Parser::builtinType(TokIter &iter,
                                                      TokIter end) {
  auto id = GetTokenID(end)(iter);
  if (id != TokenID::Bool && id != TokenID::Int && id != TokenID::String) {
    return nullptr;
  }

  Position posBeg, posEnd;
  std::tie(posBeg, posEnd) = iter->position();
  auto mk = [this, &posBeg, &posEnd](ast::BuiltinType::Type ty) {
    return makeNode<ast::BuiltinType>(posBeg, posEnd, ty);
  };

  ++iter;
  switch (id) {
  case TokenID::Bool:
    return mk(ast::BuiltinType::Bool);
  case TokenID::Int:
    return mk(ast::BuiltinType::Int);
  case TokenID::String:
    return mk(ast::BuiltinType::String);
  default:
    break;
  }
  assert(false);
}